

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O0

void nn_bipc_destroy(void *self)

{
  long in_RDI;
  nn_bipc *bipc;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_BIPC_STATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x86);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_term((nn_list *)0x13c82c);
  if (*(long *)(in_RDI + 0x2c8) != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bipc->aipc == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
            ,0x88);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_usock_term((nn_usock *)0x13c8a0);
  nn_fsm_term((nn_fsm *)0x13c8aa);
  nn_free((void *)0x13c8b4);
  return;
}

Assistant:

static void nn_bipc_destroy (void *self)
{
    struct nn_bipc *bipc = self;

    nn_assert_state (bipc, NN_BIPC_STATE_IDLE);
    nn_list_term (&bipc->aipcs);
    nn_assert (bipc->aipc == NULL);
    nn_usock_term (&bipc->usock);
    nn_fsm_term (&bipc->fsm);

    nn_free (bipc);
}